

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# collationkeys.cpp
# Opt level: O3

void __thiscall icu_63::SortKeyByteSink::Append(SortKeyByteSink *this,char *bytes,int32_t n)

{
  int iVar1;
  int iVar2;
  int iVar3;
  
  if (bytes != (char *)0x0 && 0 < n) {
    iVar1 = this->ignore_;
    if (0 < (long)iVar1) {
      iVar2 = iVar1 - n;
      iVar3 = 0;
      if (0 < iVar2) {
        iVar3 = iVar2;
      }
      this->ignore_ = iVar3;
      if (-1 < iVar2) {
        return;
      }
      bytes = bytes + iVar1;
      n = -iVar2;
    }
    iVar1 = this->appended_;
    this->appended_ = iVar1 + n;
    if (this->buffer_ + iVar1 != bytes) {
      if (n <= this->capacity_ - iVar1) {
        memcpy(this->buffer_ + iVar1,bytes,(ulong)(uint)n);
        return;
      }
      (*(this->super_ByteSink)._vptr_ByteSink[5])();
      return;
    }
  }
  return;
}

Assistant:

void
SortKeyByteSink::Append(const char *bytes, int32_t n) {
    if (n <= 0 || bytes == NULL) {
        return;
    }
    if (ignore_ > 0) {
        int32_t ignoreRest = ignore_ - n;
        if (ignoreRest >= 0) {
            ignore_ = ignoreRest;
            return;
        } else {
            bytes += ignore_;
            n = -ignoreRest;
            ignore_ = 0;
        }
    }
    int32_t length = appended_;
    appended_ += n;
    if ((buffer_ + length) == bytes) {
        return;  // the caller used GetAppendBuffer() and wrote the bytes already
    }
    int32_t available = capacity_ - length;
    if (n <= available) {
        uprv_memcpy(buffer_ + length, bytes, n);
    } else {
        AppendBeyondCapacity(bytes, n, length);
    }
}